

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

DWORD GetFileSize(HANDLE hFile,LPDWORD lpFileSizeHigh)

{
  DWORD local_2c;
  CPalThread *pCStack_28;
  DWORD dwFileSizeLow;
  CPalThread *pThread;
  LPDWORD pDStack_18;
  PAL_ERROR palError;
  LPDWORD lpFileSizeHigh_local;
  HANDLE hFile_local;
  
  pThread._4_4_ = 0;
  pDStack_18 = lpFileSizeHigh;
  lpFileSizeHigh_local = (LPDWORD)hFile;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pCStack_28 = CorUnix::InternalGetCurrentThread();
  pThread._4_4_ = CorUnix::InternalGetFileSize(pCStack_28,lpFileSizeHigh_local,&local_2c,pDStack_18)
  ;
  if (pThread._4_4_ != 0) {
    CorUnix::CPalThread::SetLastError(pThread._4_4_);
    local_2c = 0xffffffff;
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return local_2c;
}

Assistant:

DWORD
PALAPI
GetFileSize(
        IN HANDLE hFile,
        OUT LPDWORD lpFileSizeHigh)
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pThread;
    DWORD dwFileSizeLow;

    PERF_ENTRY(GetFileSize);
    ENTRY("GetFileSize(hFile=%p, lpFileSizeHigh=%p)\n", hFile, lpFileSizeHigh);

    pThread = InternalGetCurrentThread();

    palError = InternalGetFileSize(
        pThread,
        hFile, 
        &dwFileSizeLow,
        lpFileSizeHigh
        );

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
        dwFileSizeLow = INVALID_FILE_SIZE;
    }

    LOGEXIT("GetFileSize returns DWORD %u\n", dwFileSizeLow);
    PERF_EXIT(GetFileSize);
    return dwFileSizeLow;
}